

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O0

bool checkXdgRuntimeDir(QString *xdgRuntimeDir)

{
  bool bVar1;
  __uid_t _Var2;
  int iVar3;
  uint uVar4;
  Permissions lhs;
  QFileSystemEntry *entry_00;
  int *piVar5;
  ushort *puVar6;
  char *pcVar7;
  anon_class_1_0_00000001 *this;
  QFileSystemMetaData *metaData_00;
  char *pcVar8;
  QString *in_RDI;
  long in_FS_OFFSET;
  uint myUid;
  QFileSystemMetaData metaData;
  MetaDataFlags statFlags;
  Permissions wantedPerms;
  anon_class_1_0_00000001 describeMetaData;
  QFileSystemEntry entry;
  undefined4 in_stack_fffffffffffffd88;
  Permission in_stack_fffffffffffffd8c;
  enum_type in_stack_fffffffffffffd90;
  enum_type in_stack_fffffffffffffd94;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  QMessageLogger *in_stack_fffffffffffffda0;
  QFileSystemMetaData *in_stack_fffffffffffffdc8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffe20;
  QFlagsStorage<QFileDevice::Permission> permissions;
  bool local_185;
  QMessageLogger local_150;
  Int local_12c;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> in_stack_ffffffffffffff0c;
  QMessageLogger local_d8;
  Int local_b4;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_58;
  QFlagsStorageHelper<QFileDevice::Permission,_4> local_54;
  QFlagsStorage<QFileDevice::Permission> local_50;
  undefined1 local_49;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_49 = 0xaa;
  _Var2 = geteuid();
  local_50.i = 0xaaaaaaaa;
  local_54.super_QFlagsStorage<QFileDevice::Permission>.i =
       (QFlagsStorage<QFileDevice::Permission>)
       operator|(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90);
  local_50.i = (Int)QFlags<QFileDevice::Permission>::operator|
                              ((QFlags<QFileDevice::Permission> *)
                               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                               in_stack_fffffffffffffd8c);
  local_58.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)0xaaaaaaaa;
  local_58.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
       operator|(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemMetaData::QFileSystemMetaData
            ((QFileSystemMetaData *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (QString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  QFileSystemEntry::nativeFilePath
            ((QFileSystemEntry *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98));
  entry_00 = (QFileSystemEntry *)QByteArray::operator_cast_to_char_((QByteArray *)0x7dd41e);
  iVar3 = mkdir((char *)entry_00,0x1c0);
  QByteArray::~QByteArray((QByteArray *)0x7dd44e);
  if (iVar3 == 0) {
    local_185 = true;
  }
  else {
    piVar5 = __errno_location();
    if (*piVar5 == 0x11) {
      local_b4 = (Int)local_58.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
      bVar1 = QFileSystemEngine::fillMetaData
                        (entry_00,(QFileSystemMetaData *)CONCAT44(iVar3,in_stack_fffffffffffffe20),
                         (MetaDataFlags)in_stack_ffffffffffffff0c.i);
      permissions.i = (Int)((ulong)entry_00 >> 0x20);
      if ((bVar1) || (bVar1 = QFileSystemMetaData::isLink((QFileSystemMetaData *)0x7dd56e), bVar1))
      {
        bVar1 = QFileSystemMetaData::isLink((QFileSystemMetaData *)0x7dd5e3);
        if ((bVar1) ||
           (bVar1 = QFileSystemMetaData::isDirectory((QFileSystemMetaData *)0x7dd600), !bVar1)) {
          QMessageLogger::QMessageLogger
                    (in_stack_fffffffffffffda0,
                     (char *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                     in_stack_fffffffffffffd94,
                     (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
          QtPrivate::asString(in_RDI);
          puVar6 = QString::utf16((QString *)
                                  CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
          checkXdgRuntimeDir::anon_class_1_0_00000001::operator()
                    (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          pcVar7 = QByteArray::constData((QByteArray *)0x7dd67b);
          QMessageLogger::warning
                    (&local_d8,
                     "QStandardPaths: runtime directory \'%ls\' is not a directory, but %s",puVar6,
                     pcVar7);
          QByteArray::~QByteArray((QByteArray *)0x7dd6a8);
          local_185 = false;
        }
        else {
          uVar4 = QFileSystemMetaData::userId((QFileSystemMetaData *)&local_98);
          if (uVar4 == _Var2) {
            lhs = QFileSystemMetaData::permissions
                            ((QFileSystemMetaData *)
                             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
            local_12c = local_50.i;
            bVar1 = operator!=((QFlags<QFileDevice::Permission>)
                               lhs.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                               super_QFlagsStorage<QFileDevice::Permission>.i,
                               (QFlags<QFileDevice::Permission>)local_50.i);
            if (bVar1) {
              QMessageLogger::QMessageLogger
                        (in_stack_fffffffffffffda0,
                         (char *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                         in_stack_fffffffffffffd94,
                         (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
              QtPrivate::asString(in_RDI);
              puVar6 = QString::utf16((QString *)
                                      CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))
              ;
              QFileSystemMetaData::permissions
                        ((QFileSystemMetaData *)
                         CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
              unixPermissionsText((Permissions)permissions.i);
              pcVar7 = QByteArray::constData((QByteArray *)0x7dd8b7);
              unixPermissionsText((Permissions)permissions.i);
              pcVar8 = QByteArray::constData((QByteArray *)0x7dd8ed);
              QMessageLogger::warning
                        (&local_150,
                         "QStandardPaths: wrong permissions on runtime directory %ls, %s instead of %s"
                         ,puVar6,pcVar7,pcVar8);
              QByteArray::~QByteArray((QByteArray *)0x7dd91f);
              QByteArray::~QByteArray((QByteArray *)0x7dd92c);
              local_185 = false;
            }
            else {
              local_185 = true;
            }
          }
          else {
            QMessageLogger::QMessageLogger
                      (in_stack_fffffffffffffda0,
                       (char *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                       in_stack_fffffffffffffd94,
                       (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
            this = (anon_class_1_0_00000001 *)QtPrivate::asString(in_RDI);
            metaData_00 = (QFileSystemMetaData *)
                          QString::utf16((QString *)
                                         CONCAT44(in_stack_fffffffffffffd94,
                                                  in_stack_fffffffffffffd90));
            checkXdgRuntimeDir::anon_class_1_0_00000001::operator()(this,metaData_00);
            pcVar7 = QByteArray::constData((QByteArray *)0x7dd780);
            QMessageLogger::warning
                      ((QMessageLogger *)&stack0xfffffffffffffef0,
                       "QStandardPaths: runtime directory \'%ls\' is not owned by UID %d, but %s",
                       metaData_00,(ulong)_Var2,pcVar7);
            QByteArray::~QByteArray((QByteArray *)0x7dd7b1);
            local_185 = false;
          }
        }
      }
      else {
        QtPrivate::asString(in_RDI);
        puVar6 = QString::utf16((QString *)
                                CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        qErrnoWarning("QStandardPaths: error obtaining permissions of runtime directory \'%ls\'",
                      puVar6);
        local_185 = false;
      }
    }
    else {
      QtPrivate::asString(in_RDI);
      puVar6 = QString::utf16((QString *)
                              CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      qErrnoWarning("QStandardPaths: error creating runtime directory \'%ls\'",puVar6);
      local_185 = false;
    }
  }
  QFileSystemEntry::~QFileSystemEntry
            ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_185;
}

Assistant:

static bool checkXdgRuntimeDir(const QString &xdgRuntimeDir)
{
    auto describeMetaData = [](const QFileSystemMetaData &metaData) -> QByteArray {
        if (!metaData.exists())
            return "a broken symlink";

        QByteArray description;
        if (metaData.isLink())
            description = "a symbolic link to ";

        if (metaData.isFile())
            description += "a regular file";
        else if (metaData.isDirectory())
            description += "a directory";
        else if (metaData.isSequential())
            description += "a character device, socket or FIFO";
        else
            description += "a block device";

        description += " permissions " + unixPermissionsText(metaData.permissions());

        return description
                + " owned by UID " + QByteArray::number(metaData.userId())
                + " GID " + QByteArray::number(metaData.groupId());
    };

    // http://standards.freedesktop.org/basedir-spec/latest/
    const uint myUid = uint(geteuid());
    const QFile::Permissions wantedPerms = QFile::ReadOwner | QFile::WriteOwner | QFile::ExeOwner;
    const QFileSystemMetaData::MetaDataFlags statFlags = QFileSystemMetaData::PosixStatFlags
                                                         | QFileSystemMetaData::LinkType;
    QFileSystemMetaData metaData;
    QFileSystemEntry entry(xdgRuntimeDir);

    // Check that the xdgRuntimeDir is a directory by attempting to create it.
    // A stat() before mkdir() that concluded it doesn't exist is a meaningless
    // result: we'd race against someone else attempting to create it.
    // ### QFileSystemEngine::createDirectory cannot take the extra mode argument.
    if (QT_MKDIR(entry.nativeFilePath(), 0700) == 0)
        return true;
    if (errno != EEXIST) {
        qErrnoWarning("QStandardPaths: error creating runtime directory '%ls'",
                      qUtf16Printable(xdgRuntimeDir));
        return false;
    }

    // We use LinkType to force an lstat(), but fillMetaData() still returns error
    // on broken symlinks.
    if (!QFileSystemEngine::fillMetaData(entry, metaData, statFlags) && !metaData.isLink()) {
        qErrnoWarning("QStandardPaths: error obtaining permissions of runtime directory '%ls'",
                      qUtf16Printable(xdgRuntimeDir));
        return false;
    }

    // Checks:
    // - is a directory
    // - is not a symlink (even is pointing to a directory)
    if (metaData.isLink() || !metaData.isDirectory()) {
        qWarning("QStandardPaths: runtime directory '%ls' is not a directory, but %s",
                 qUtf16Printable(xdgRuntimeDir), describeMetaData(metaData).constData());
        return false;
    }

    // - "The directory MUST be owned by the user"
    if (metaData.userId() != myUid) {
        qWarning("QStandardPaths: runtime directory '%ls' is not owned by UID %d, but %s",
                 qUtf16Printable(xdgRuntimeDir), myUid, describeMetaData(metaData).constData());
        return false;
    }

    // "and he MUST be the only one having read and write access to it. Its Unix access mode MUST be 0700."
    if (metaData.permissions() != wantedPerms) {
        qWarning("QStandardPaths: wrong permissions on runtime directory %ls, %s instead of %s",
                 qUtf16Printable(xdgRuntimeDir),
                 unixPermissionsText(metaData.permissions()).constData(),
                 unixPermissionsText(wantedPerms).constData());
        return false;
    }

    return true;
}